

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O0

ICommandQueueVk * __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::GetCommandQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  *this,SoftwareQueueIndex CommandQueueInd)

{
  CommandQueue *pCVar1;
  Uint32 UVar2;
  Char *Message;
  ICommandQueueVk *pIVar3;
  undefined1 local_38 [8];
  string msg;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  *this_local;
  SoftwareQueueIndex CommandQueueInd_local;
  
  msg.field_2._8_8_ = this;
  this_local._7_1_ = CommandQueueInd.m_Value;
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
  if (this->m_CmdQueueCount <= (ulong)UVar2) {
    FormatString<char[26],char[34]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CommandQueueInd < m_CmdQueueCount",(char (*) [34])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetCommandQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0xf6);
    std::__cxx11::string::~string((string *)local_38);
  }
  pCVar1 = this->m_CommandQueues;
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
  pIVar3 = RefCntAutoPtr<Diligent::ICommandQueueVk>::operator*(&pCVar1[UVar2].CmdQueue);
  return pIVar3;
}

Assistant:

const CommandQueueType& GetCommandQueue(SoftwareQueueIndex CommandQueueInd) const
    {
        VERIFY_EXPR(CommandQueueInd < m_CmdQueueCount);
        return *m_CommandQueues[CommandQueueInd].CmdQueue;
    }